

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_mustache(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,string_type *input,
              context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *ctx)

{
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parser;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  (this->error_message_)._M_string_length = 0;
  (this->error_message_).field_2._M_local_buf[0] = '\0';
  (this->root_component_).text._M_dataplus._M_p = (pointer)&(this->root_component_).text.field_2;
  (this->root_component_).text._M_string_length = 0;
  (this->root_component_).text.field_2._M_local_buf[0] = '\0';
  (this->root_component_).tag.name._M_dataplus._M_p =
       (pointer)&(this->root_component_).tag.name.field_2;
  (this->root_component_).tag.name._M_string_length = 0;
  (this->root_component_).tag.name.field_2._M_local_buf[0] = '\0';
  (this->root_component_).tag.type = text;
  (this->root_component_).tag.section_text.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->root_component_).tag.section_text.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_component_).tag.delim_set.
  super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->root_component_).tag.delim_set.
  super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root_component_).position = 0xffffffffffffffff;
  *(undefined8 *)&(this->escape_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->escape_).super__Function_base._M_functor + 8) = 0;
  (this->escape_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->escape_)._M_invoker = (_Invoker_type)0x0;
  *(code **)&(this->escape_).super__Function_base._M_functor = html_escape<std::__cxx11::string>;
  (this->escape_)._M_invoker =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  (this->escape_).super__Function_base._M_manager =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
            (&local_11,input,ctx,&this->root_component_,&this->error_message_);
  return;
}

Assistant:

basic_mustache(const string_type& input, context_internal<string_type>& ctx)
        : basic_mustache() {
        parser<string_type> parser{input, ctx, root_component_, error_message_};
    }